

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationY.cpp
# Opt level: O2

bool check_qclab_qgates_RotationY<float>
               (vector<float,_std::allocator<float>_> *v1,vector<float,_std::allocator<float>_> *v2)

{
  pointer pfVar1;
  pointer pfVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  pfVar1 = (v1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  lVar4 = (long)(v1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar1;
  pfVar2 = (v2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if (lVar4 != (long)(v2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pfVar2) {
    __assert_fail("v1.size() == v2.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/RotationY.cpp"
                  ,0xb,
                  "bool check_qclab_qgates_RotationY(const std::vector<T> &, const std::vector<T> &) [T = float]"
                 );
  }
  uVar5 = lVar4 >> 2;
  uVar3 = 0;
  do {
    uVar6 = uVar3;
    if (uVar5 == uVar6) break;
    uVar3 = uVar6 + 1;
  } while (ABS(pfVar1[uVar6] - pfVar2[uVar6]) <= 1.1920929e-05);
  return uVar5 <= uVar6;
}

Assistant:

bool check_qclab_qgates_RotationY( const std::vector< T >& v1 ,
                                   const std::vector< T >& v2 ) {

  using R = qclab::real_t< T > ;
  const R tol = 100 * std::numeric_limits< R >::epsilon() ;

  assert( v1.size() == v2.size() ) ;
  for ( size_t i = 0; i < v1.size(); ++i ) {
    if ( std::abs( v1[i] - v2[i] ) > tol ) return false ;
  }
  return true ;

}